

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadataWithArena::DoClear(InternalMetadataWithArena *this)

{
  void *pvVar1;
  UnknownFieldSet *this_00;
  
  pvVar1 = (this->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    UnknownFieldSet::Clear((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
    return;
  }
  this_00 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
            ::mutable_unknown_fields_slow
                      (&this->
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      );
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void DoClear() {
    mutable_unknown_fields()->Clear();
  }